

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O1

void __thiscall BMRS_XZ<UF>::PerformLabeling(BMRS_XZ<UF> *this)

{
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Mat1b *pMVar7;
  int *piVar8;
  Mat1i *pMVar9;
  uint *puVar10;
  Run *pRVar11;
  uint uVar12;
  int iVar13;
  uint64_t *puVar14;
  uint64_t *puVar15;
  uint64_t *puVar16;
  Run *pRVar17;
  int iVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  uint64_t *puVar25;
  uint uVar26;
  uint64_t *puVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  uint uVar31;
  uint64_t *puVar32;
  int iVar33;
  ulong uVar34;
  long local_100;
  Mat local_90 [96];
  
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar4 = *(int *)&pMVar7->field_0x8;
  uVar5 = *(uint *)&pMVar7->field_0xc;
  (this->data_compressed).height = iVar4;
  uVar22 = uVar5 + 0x3f;
  if (-1 < (int)uVar5) {
    uVar22 = uVar5;
  }
  (this->data_compressed).width = uVar5;
  iVar33 = (int)uVar22 >> 6;
  iVar6 = iVar33 + 1;
  (this->data_compressed).data_width = iVar6;
  uVar23 = (long)(iVar6 * iVar4) * 8;
  if (iVar6 * iVar4 < 0) {
    uVar23 = 0xffffffffffffffff;
  }
  puVar14 = (uint64_t *)operator_new__(uVar23);
  (this->data_compressed).bits = puVar14;
  InitCompressedData(this,&this->data_compressed);
  uVar20 = iVar4 / 2;
  iVar18 = iVar4 % 2;
  uVar12 = uVar20 + iVar18;
  uVar22 = (this->data_compressed).data_width;
  uVar34 = (ulong)uVar22;
  (this->data_merged).height = uVar12;
  (this->data_merged).width = uVar5;
  (this->data_merged).data_width = iVar6;
  uVar23 = (long)(int)(uVar12 * iVar6) * 8;
  if ((int)(uVar12 * iVar6) < 0) {
    uVar23 = 0xffffffffffffffff;
  }
  puVar14 = (uint64_t *)operator_new__(uVar23);
  (this->data_merged).bits = puVar14;
  if (1 < iVar4) {
    puVar15 = (this->data_compressed).bits;
    lVar19 = (long)(this->data_compressed).data_width;
    puVar16 = puVar15 + lVar19;
    uVar23 = 0;
    puVar27 = puVar14;
    do {
      if (0 < (int)uVar22) {
        uVar28 = 0;
        do {
          puVar27[uVar28] = puVar16[uVar28] | puVar15[uVar28];
          uVar28 = uVar28 + 1;
        } while (uVar34 != uVar28);
      }
      uVar23 = uVar23 + 1;
      puVar27 = puVar27 + (long)iVar33 + 1;
      puVar16 = puVar16 + lVar19 * 2;
      puVar15 = puVar15 + lVar19 * 2;
    } while (uVar23 != uVar20);
  }
  if ((iVar18 != 0) && (0 < (int)uVar22)) {
    iVar13 = (this->data_compressed).data_width;
    puVar16 = (this->data_compressed).bits;
    uVar23 = 0;
    do {
      puVar14[(long)(int)uVar20 * (long)iVar6 + uVar23] =
           puVar16[(long)iVar13 * (long)(iVar4 + -1) + uVar23];
      uVar23 = uVar23 + 1;
    } while (uVar34 != uVar23);
  }
  (this->data_flags).height = uVar12 - 1;
  (this->data_flags).width = uVar5;
  (this->data_flags).data_width = iVar6;
  iVar13 = (uVar12 - 1) * iVar6;
  uVar23 = 0xffffffffffffffff;
  if (-1 < iVar13) {
    uVar23 = (long)iVar13 * 8;
  }
  puVar16 = (uint64_t *)operator_new__(uVar23);
  (this->data_flags).bits = puVar16;
  lVar19 = (long)(this->data_flags).height;
  if (0 < lVar19) {
    puVar27 = (this->data_compressed).bits;
    lVar21 = (long)(this->data_compressed).data_width;
    puVar15 = puVar27 + lVar21;
    lVar29 = 0;
    puVar32 = puVar16;
    puVar25 = puVar27;
    do {
      puVar25 = puVar25 + lVar21 * 2;
      puVar16[lVar29 * iVar6] =
           (puVar27[(lVar29 * 2 + 2) * lVar21] * 2 | puVar27[(lVar29 * 2 + 2) * lVar21]) &
           (puVar27[(lVar29 * 2 + 1) * lVar21] * 2 | puVar27[(lVar29 * 2 + 1) * lVar21]);
      if (1 < (int)uVar22) {
        uVar23 = 1;
        do {
          puVar32[uVar23] =
               (puVar25[uVar23 - 1] >> 0x3f | puVar25[uVar23] << 1 | puVar25[uVar23]) &
               (puVar15[uVar23 - 1] >> 0x3f | puVar15[uVar23] << 1 | puVar15[uVar23]);
          uVar23 = uVar23 + 1;
        } while (uVar34 != uVar23);
      }
      lVar29 = lVar29 + 1;
      puVar32 = puVar32 + (long)iVar33 + 1;
      puVar15 = puVar15 + lVar21 * 2;
    } while (lVar29 != lVar19);
  }
  (this->data_runs).height = uVar12;
  (this->data_runs).width = uVar5;
  pRVar17 = (Run *)operator_new__((ulong)(((uVar5 >> 1) + 2) * uVar12 + 1) << 3);
  (this->data_runs).runs = pRVar17;
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar6 = *(int *)&pMVar7->field_0x8;
  iVar33 = *(int *)&pMVar7->field_0xc;
  UF::P_ = (uint *)operator_new__((ulong)(((iVar33 - (iVar33 + 1 >> 0x1f)) + 1 >> 1) *
                                          ((iVar6 - (iVar6 + 1 >> 0x1f)) + 1 >> 1) + 1) << 2);
  *UF::P_ = 0;
  UF::length_ = 1;
  FindRuns(this,puVar14,puVar16,uVar12,uVar22,pRVar17);
  piVar8 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_90,*piVar8,piVar8[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pRVar17 = (this->data_runs).runs;
  if (1 < iVar4) {
    pMVar9 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    puVar14 = (this->data_compressed).bits;
    lVar19 = *(long *)&pMVar9->field_0x10;
    lVar21 = **(long **)&pMVar9->field_0x48;
    uVar23 = 0;
    local_100 = lVar19;
    do {
      puVar10 = UF::P_;
      lVar29 = lVar21 * 2 * uVar23;
      iVar6 = (this->data_compressed).data_width;
      iVar33 = (int)uVar23 * iVar6;
      uVar22 = 0;
      pRVar11 = pRVar17;
      do {
        pRVar17 = pRVar11;
        uVar2 = pRVar17->start_pos;
        if (uVar2 == 0xffff) {
          if ((int)uVar22 < (int)uVar5) {
            memset((void *)(lVar29 + lVar19 + (long)(int)uVar22 * 4),0,
                   (ulong)(uVar5 + ~uVar22) * 4 + 4);
            memset((void *)(lVar21 + lVar19 + lVar29 + (long)(int)uVar22 * 4),0,
                   (ulong)(~uVar22 + uVar5) * 4 + 4);
          }
          pRVar17 = pRVar17 + 1;
        }
        else {
          uVar3 = pRVar17->end_pos;
          uVar12 = puVar10[pRVar17->label];
          if ((int)uVar22 < (int)(uint)uVar2) {
            lVar1 = local_100 + (long)(int)uVar22 * 4;
            lVar24 = 0;
            do {
              *(undefined4 *)(lVar1 + lVar24 * 4) = 0;
              *(undefined4 *)(lVar21 + lVar1 + lVar24 * 4) = 0;
              lVar24 = lVar24 + 1;
            } while ((ulong)uVar2 - (long)(int)uVar22 != lVar24);
            uVar22 = uVar22 + (int)lVar24;
          }
          if ((int)uVar22 < (int)(uint)uVar3) {
            lVar1 = local_100 + (long)(int)uVar22 * 4;
            lVar24 = 0;
            do {
              lVar30 = (long)((int)(uVar22 + (int)lVar24) >> 6);
              uVar26 = (int)lVar24 + uVar22 & 0x3f;
              uVar31 = uVar12;
              if ((puVar14[iVar33 * 2 + lVar30] >> uVar26 & 1) == 0) {
                uVar31 = 0;
              }
              *(uint *)(lVar1 + lVar24 * 4) = uVar31;
              uVar31 = uVar12;
              if ((puVar14[(long)(iVar33 * 2) + iVar6 + lVar30] >> uVar26 & 1) == 0) {
                uVar31 = 0;
              }
              *(uint *)(lVar21 + lVar1 + lVar24 * 4) = uVar31;
              lVar24 = lVar24 + 1;
            } while (((long)(int)uVar22 - (ulong)uVar3) + lVar24 != 0);
            uVar22 = uVar22 + (int)lVar24;
          }
        }
        pRVar11 = pRVar17 + 1;
      } while (uVar2 != 0xffff);
      uVar23 = uVar23 + 1;
      local_100 = local_100 + lVar21 * 2;
    } while (uVar23 != uVar20);
  }
  puVar10 = UF::P_;
  if (iVar18 != 0) {
    pMVar9 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar19 = (long)(iVar4 + -1) * **(long **)&pMVar9->field_0x48 + *(long *)&pMVar9->field_0x10;
    uVar23 = 0;
    do {
      uVar2 = pRVar17->start_pos;
      uVar22 = (uint)uVar23;
      if (uVar2 == 0xffff) {
        if ((int)uVar22 < (int)uVar5) {
          memset((void *)(lVar19 + (long)(int)uVar22 * 4),0,(ulong)(~uVar22 + uVar5) * 4 + 4);
        }
      }
      else {
        uVar3 = pRVar17->end_pos;
        uVar12 = puVar10[pRVar17->label];
        uVar20 = (uint)uVar2;
        if ((int)uVar22 < (int)uVar20) {
          memset((void *)(lVar19 + (long)(int)uVar22 * 4),0,(ulong)(~uVar22 + uVar20) * 4 + 4);
        }
        uVar23 = (ulong)uVar20;
        if (uVar2 < uVar3) {
          uVar23 = (ulong)uVar20;
          do {
            *(uint *)(lVar19 + uVar23 * 4) = uVar12;
            uVar23 = uVar23 + 1;
          } while (uVar3 != uVar23);
        }
      }
      pRVar17 = pRVar17 + 1;
    } while (uVar2 != 0xffff);
  }
  if (UF::P_ != (uint *)0x0) {
    operator_delete__(UF::P_);
  }
  pRVar17 = (this->data_runs).runs;
  if (pRVar17 != (Run *)0x0) {
    operator_delete__(pRVar17);
  }
  puVar14 = (this->data_flags).bits;
  if (puVar14 != (uint64_t *)0x0) {
    operator_delete__(puVar14);
  }
  puVar14 = (this->data_merged).bits;
  if (puVar14 != (uint64_t *)0x0) {
    operator_delete__(puVar14);
  }
  puVar14 = (this->data_compressed).bits;
  if (puVar14 != (uint64_t *)0x0) {
    operator_delete__(puVar14);
  }
  return;
}

Assistant:

void PerformLabeling()
    {
		int w(img_.cols);
		int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedData(data_compressed);

        //generate merged data
        int h_merge = h / 2 + h % 2;
        int data_width = data_compressed.data_width;
        data_merged.Alloc(h_merge, w);
        for (int i = 0; i < h / 2; i++) {
            uint64_t* pdata_source1 = data_compressed[2 * i];
            uint64_t* pdata_source2 = data_compressed[2 * i + 1];
            uint64_t* pdata_merged = data_merged[i];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source1[j] | pdata_source2[j];
        }
        if (h % 2) {
            uint64_t* pdata_source = data_compressed[h - 1];
            uint64_t* pdata_merged = data_merged[h / 2];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source[j];
        }

        //generate flag bits
        data_flags.Alloc(h_merge - 1, w);
        for (int i = 0; i < data_flags.height; i++) {
            uint64_t* bits_u = data_compressed[2 * i + 1];
            uint64_t* bits_d = data_compressed[2 * i + 2];
            uint64_t* bits_dest = data_flags[i];

            uint64_t u0 = bits_u[0];
            uint64_t d0 = bits_d[0];
            bits_dest[0] = (u0 | (u0 << 1)) & (d0 | (d0 << 1));
            for (int j = 1; j < data_width; j++) {
                uint64_t u = bits_u[j];
                uint64_t u_shl = u << 1;
                uint64_t d = bits_d[j];
                uint64_t d_shl = d << 1;
                if (bits_u[j - 1] & 0x8000000000000000) u_shl |= 1;
                if (bits_d[j - 1] & 0x8000000000000000) d_shl |= 1;
                bits_dest[j] = (u | u_shl) & (d | d_shl);
            }
        }

        //find runs
        data_runs.Alloc(h_merge, w);
        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();
        FindRuns(data_merged.bits, data_flags.bits, h_merge, data_width, data_runs.runs);

        img_labels_ = cv::Mat1i(img_.size());

        // New version (uses 1-byte per pixel input)
        Run* runs = data_runs.runs;
        for (int i = 0; i < h / 2; i++) {
            const uint64_t* const data_u = data_compressed.bits + data_compressed.data_width * 2 * i;
            const uint64_t* const data_d = data_u + data_compressed.data_width;
            unsigned* const labels_u = img_labels_.ptr<unsigned>(2 * i);
            unsigned* const labels_d = img_labels_.ptr<unsigned>(2 * i + 1);

            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) labels_u[k] = 0;
                    for (int k = j; k < w; k++) labels_d[k] = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);

                for (; j < start_pos; j++) labels_u[j] = 0, labels_d[j] = 0;
                for (; j < end_pos; j++) {
                    labels_u[j] = (data_u[j >> 6] & (1ull << (j & 0x3F))) ? label : 0;
                    labels_d[j] = (data_d[j >> 6] & (1ull << (j & 0x3F))) ? label : 0;
                }
            }
        }
        if (h % 2) {
            unsigned* const labels = img_labels_.ptr<unsigned>(h - 1);
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) labels[k] = 0;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (; j < start_pos; j++) labels[j] = 0;
                for (j = start_pos; j < end_pos; j++) labels[j] = label;
            }
        }

        LabelsSolver::Dealloc();
        data_runs.Dealloc();
        data_flags.Dealloc();
        data_merged.Dealloc();
        data_compressed.Dealloc();
    }